

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O1

void __thiscall TPZTensor<double>::TPZTensor(TPZTensor<double> *this,TPZDecomposed *eigensystem)

{
  double *pdVar1;
  TPZTensor<double> *pTVar2;
  uint *puVar3;
  double *pdVar4;
  double *pdVar5;
  int i;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_0189f0b0;
  uVar8 = 0;
  TPZVec<double>::TPZVec(&(this->fData).super_TPZVec<double>,0);
  (this->fData).super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0189f470;
  pdVar1 = (this->fData).fExtAlloc;
  (this->fData).super_TPZVec<double>.fStore = pdVar1;
  (this->fData).super_TPZVec<double>.fNElements = 6;
  (this->fData).super_TPZVec<double>.fNAlloc = 0;
  (this->fData).fExtAlloc[0] = 0.0;
  (this->fData).fExtAlloc[1] = 0.0;
  (this->fData).fExtAlloc[2] = 0.0;
  (this->fData).fExtAlloc[3] = 0.0;
  (this->fData).fExtAlloc[4] = 0.0;
  (this->fData).fExtAlloc[5] = 0.0;
  pTVar2 = (eigensystem->fEigentensors).super_TPZVec<TPZTensor<double>_>.fStore;
  puVar3 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
  pdVar4 = (eigensystem->fEigenvalues).super_TPZVec<double>.fStore;
  do {
    pdVar5 = pTVar2[uVar8].fData.super_TPZVec<double>.fStore;
    lVar6 = 0;
    do {
      pdVar1[lVar6] = pdVar5[lVar6] * pdVar4[uVar8] + pdVar1[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    uVar7 = puVar3[uVar8] + (int)uVar8;
    uVar8 = (ulong)uVar7;
  } while (uVar7 < 3);
  return;
}

Assistant:

TPZTensor(const TPZDecomposed &eigensystem) : fData(6, T(0.)) {
        unsigned int i;
        for (i = 0; i < 3; i += eigensystem.fGeometricMultiplicity[i]) {
            Add(eigensystem.fEigentensors[i], eigensystem.fEigenvalues[i]);
        }
#ifdef PZDEBUG
        if (i != 3) {
            DebugStop();
        }
#endif
    }